

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O3

void __thiscall SocketOnline::recv_message(SocketOnline *this,Mat *a)

{
  SOCK sock;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  char *p;
  char *local_30;
  
  iVar2 = this->sock;
  pcVar4 = this->header;
  iVar1 = 0;
  do {
    sVar3 = read(iVar2,pcVar4,(ulong)(4 - iVar1));
    pcVar4 = pcVar4 + (int)sVar3;
    iVar1 = (int)sVar3 + iVar1;
  } while (iVar1 < 4);
  this->recv_num = this->recv_num + 4;
  sock = this->sock;
  pcVar4 = this->buffer;
  iVar2 = Mat::getStringLen(a);
  recv_message_n(this,sock,pcVar4,iVar2);
  local_30 = this->buffer;
  Mat::addFrom_pos(a,&local_30);
  return;
}

Assistant:

void SocketOnline::recv_message(Mat *a) {
    recv_message_n(sock, header, HEADER_LEN);
    recv_message_n(sock, buffer, a->getStringLen());
    char* p = buffer;
    a->addFrom_pos(p);
//    cout << "--------------" << endl;
}